

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O2

ssize_t dma_read(nettlp *nt,uintptr_t addr,void *buf,size_t count)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  ushort uVar5;
  byte bVar6;
  void *__src;
  void *__dest;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  undefined8 local_f8;
  byte local_ec [2];
  ushort local_ea;
  ushort local_e6;
  byte local_e1;
  nettlp *local_e0;
  uint64_t dst_addr64;
  pollfd x [1];
  nettlp_hdr nh;
  nettlp_hdr nh_1;
  iovec iov [4];
  iovec local_78;
  undefined1 *local_68;
  undefined8 local_60;
  uint64_t *local_58;
  undefined8 local_50;
  char rest [16];
  
  local_68 = (undefined1 *)&local_f8;
  local_78.iov_base = &nh;
  nh._0_4_ = 0;
  nh.tstamp._2_2_ = 0;
  local_78.iov_len = 6;
  local_60 = 8;
  uVar2 = (uint)addr;
  if (addr < 0xffffffff) {
    dst_addr64 = CONCAT44(dst_addr64._4_4_,
                          uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          (uVar2 & 0xfffffffc) << 0x18);
    local_50 = 4;
    bVar6 = 0;
  }
  else {
    dst_addr64 = addr >> 0x38 | (addr & 0xff000000000000) >> 0x28 | (addr & 0xff0000000000) >> 0x18
                 | (addr & 0xff00000000) >> 8 | (addr & 0xff000000) << 8 | (addr & 0xff0000) << 0x18
                 | (addr & 0xff00) << 0x28 | (addr & 0xfc) << 0x38;
    local_50 = 8;
    bVar6 = 0x20;
  }
  local_58 = &dst_addr64;
  local_f8._0_4_ = (uint)bVar6;
  local_f8._0_7_ =
       CONCAT16(nt->tag,CONCAT24(nt->requester << 8 | nt->requester >> 8,(uint)local_f8));
  local_f8 = (ulong)(uint7)local_f8;
  iVar1 = tlp_calculate_lstdw(addr,count);
  uVar9 = local_f8;
  uVar7 = ~(0xf << ((byte)count & 0x1f)) & 7;
  if (3 < count) {
    uVar7 = 0xf;
  }
  local_f8 = CONCAT17((byte)(uVar7 << ((byte)addr & 3)) & 0xf | (char)iVar1 << 4,(uint7)local_f8);
  uVar7 = uVar2 + (int)count;
  uVar5 = ((short)(uVar7 - (uVar2 & 0x3fffc) >> 2) + 1) - (ushort)((uVar7 & 3) == 0);
  local_f8._0_4_ = CONCAT22(uVar5 * 0x100 | uVar5 >> 8,(short)uVar9);
  sVar3 = writev(nt->sockfd,&local_78,3);
  iVar1 = (int)sVar3;
  if (-1 < iVar1) {
    iov[0].iov_base = &nh_1;
    iov[0].iov_len = 6;
    iov[1].iov_base = local_ec;
    iov[1].iov_len = 0xc;
    iov[3].iov_base = rest;
    iov[3].iov_len = 0x10;
    x[0].fd = nt->sockfd;
    x[0].events = 1;
    lVar8 = 0;
    local_e0 = nt;
    while( true ) {
      iVar1 = poll((pollfd *)x,1,500);
      if (iVar1 < 0) break;
      if (iVar1 == 0) {
        piVar4 = __errno_location();
        *piVar4 = 0x3e;
        return -1;
      }
      if (((byte)x[0].revents & 1) == 0) break;
      iov[2].iov_base = (void *)((long)buf + lVar8);
      iov[2].iov_len = count - lVar8;
      sVar3 = readv(nt->sockfd,(iovec *)iov,4);
      iVar1 = (int)sVar3;
      if (iVar1 < 0) break;
      if ((local_ec[0] & 0x5f) != 0x4a) {
        piVar4 = __errno_location();
        *piVar4 = 0x4a;
        return -1;
      }
      uVar5 = local_e6 << 8 | local_e6 >> 8;
      if (0x1fff < uVar5) {
        uVar2 = uVar5 & 0xe000;
        if ((short)uVar2 == -0x8000) {
          piVar4 = __errno_location();
          *piVar4 = 0x67;
          return -1;
        }
        if (uVar2 == 0x4000) {
          piVar4 = __errno_location();
          *piVar4 = 0x16;
          return -1;
        }
        if (uVar2 == 0x2000) {
          piVar4 = __errno_location();
          *piVar4 = 0x5f;
          return -1;
        }
      }
      if ((local_e1 & 3) != 0) {
        iVar1 = (int)((ulong)local_e1 & 3);
        uVar2 = (int)iov[2].iov_len - iVar1;
        if ((int)uVar2 < 1) {
          __src = (void *)((long)(iVar1 - (int)iov[2].iov_len) + (long)iov[3].iov_base);
          uVar2 = uVar5 & 0xfff;
          __dest = iov[2].iov_base;
        }
        else {
          uVar9 = (ulong)(uVar2 & 0x7fffffff);
          memmove(iov[2].iov_base,(void *)(((ulong)local_e1 & 3) + (long)iov[2].iov_base),uVar9);
          uVar2 = local_e1 & 3;
          __src = iov[3].iov_base;
          __dest = (void *)(uVar9 + (long)iov[2].iov_base);
        }
        memmove(__dest,__src,(ulong)uVar2);
        nt = local_e0;
      }
      uVar2 = (uint)(ushort)(local_ea << 8 | local_ea >> 8);
      uVar5 = (local_e6 & 0xff0f) << 8 | local_e6 >> 8;
      if ((local_e1 & 3) + (uint)uVar5 + 3 >> 2 == (uVar2 & 0x3ff)) {
        return lVar8 + (ulong)uVar5;
      }
      lVar8 = lVar8 + (ulong)(uVar2 & 0x3ff) * 4;
    }
  }
  return (long)iVar1;
}

Assistant:

ssize_t dma_read(struct nettlp *nt, uintptr_t addr, void *buf, size_t count)
{
	int ret;
	struct iovec iov[3];
	struct nettlp_hdr nh;
	struct tlp_mr_hdr mh;
	uint64_t dst_addr64;
	uint32_t dst_addr32;

	memset(&nh, 0, sizeof(nh));
	memset(&mh, 0, sizeof(mh));

	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &mh;
	iov[1].iov_len = sizeof(mh);

	/* build memory read request  */
	tlp_set_type(mh.tlp.fmt_type, TLP_TYPE_MRd);
	if (addr < UINT32_MAX) {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_WO_DATA);
		dst_addr32 = htobe32(addr & 0xFFFFFFFC);
		iov[2].iov_base = &dst_addr32;
		iov[2].iov_len = sizeof(dst_addr32);
	} else {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_4DW, TLP_FMT_WO_DATA);
		dst_addr64 = htobe64(addr & 0xFFFFFFFFFFFFFFFC);
		iov[2].iov_base = &dst_addr64;
		iov[2].iov_len = sizeof(dst_addr64);
	}
	mh.requester = ntohs(nt->requester);
	mh.tag = nt->tag;
	mh.lstdw = tlp_calculate_lstdw(addr, count);
	mh.fstdw = tlp_calculate_fstdw(addr, count);
	tlp_set_length(mh.tlp.falen, tlp_calculate_length(addr, count));
	

	ret = writev(nt->sockfd, iov, 3);
	if (ret < 0)
		return ret;

	return libtlp_read_cpld(nt, buf, count);
}